

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

PyTypeObject * pybind11::detail::make_static_property_type(void)

{
  int iVar1;
  PyTypeObject *pPVar2;
  handle hVar3;
  error_already_set *this;
  object name_obj;
  handle local_20;
  handle local_18;
  
  local_18.m_ptr = (PyObject *)PyUnicode_FromString("pybind11_static_property");
  pPVar2 = (PyTypeObject *)(*_PyIndex_Check)(&PyType_Type,0);
  if (pPVar2 == (PyTypeObject *)0x0) {
    pybind11_fail("make_static_property_type(): error allocating type!");
  }
  hVar3.m_ptr = (PyObject *)__tls_get_addr(&PTR_0013fe00);
  (hVar3.m_ptr)->ob_refcnt = (hVar3.m_ptr)->ob_refcnt + 1;
  if (local_18.m_ptr == (PyObject *)0x0) {
    pPVar2[2].tp_basicsize = 0;
  }
  else {
    (local_18.m_ptr)->ob_refcnt = (local_18.m_ptr)->ob_refcnt + 1;
    pPVar2[2].tp_basicsize = (Py_ssize_t)local_18.m_ptr;
    (hVar3.m_ptr)->ob_refcnt = (hVar3.m_ptr)->ob_refcnt + 1;
    hVar3.m_ptr = local_18.m_ptr;
  }
  (hVar3.m_ptr)->ob_refcnt = (hVar3.m_ptr)->ob_refcnt + 1;
  pPVar2[2].tp_dealloc = (destructor)local_18.m_ptr;
  pPVar2->tp_name = "pybind11_static_property";
  _PyProperty_Type = _PyProperty_Type + 1;
  pPVar2->tp_base = (_typeobject *)&PyProperty_Type;
  pPVar2->tp_flags = 0x600;
  pPVar2->tp_descr_get = pybind11_static_get;
  pPVar2->tp_descr_set = pybind11_static_set;
  iVar1 = PyType_Ready(pPVar2);
  if (-1 < iVar1) {
    str::str((str *)&local_20,"pybind11_builtins");
    iVar1 = PyObject_SetAttrString(pPVar2,"__module__",local_20.m_ptr);
    if (iVar1 == 0) {
      object::~object((object *)&local_20);
      object::~object((object *)&local_18);
      return pPVar2;
    }
    this = (error_already_set *)__cxa_allocate_exception(0x18);
    error_already_set::error_already_set(this);
    __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  pybind11_fail("make_static_property_type(): failure in PyType_Ready()!");
}

Assistant:

inline PyTypeObject *make_static_property_type() {
    constexpr auto *name = "pybind11_static_property";
    auto name_obj = reinterpret_steal<object>(PYBIND11_FROM_STRING(name));

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto *heap_type = (PyHeapTypeObject *) PyType_Type.tp_alloc(&PyType_Type, 0);
    if (!heap_type) {
        pybind11_fail("make_static_property_type(): error allocating type!");
    }

    heap_type->ht_name = name_obj.inc_ref().ptr();
#    ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = name_obj.inc_ref().ptr();
#    endif

    auto *type = &heap_type->ht_type;
    type->tp_name = name;
    type->tp_base = type_incref(&PyProperty_Type);
    type->tp_flags = Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;
    type->tp_descr_get = pybind11_static_get;
    type->tp_descr_set = pybind11_static_set;

    if (PyType_Ready(type) < 0) {
        pybind11_fail("make_static_property_type(): failure in PyType_Ready()!");
    }

    setattr((PyObject *) type, "__module__", str("pybind11_builtins"));
    PYBIND11_SET_OLDPY_QUALNAME(type, name_obj);

    return type;
}